

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

void __thiscall
ear::RegionHandler::RegionHandler(RegionHandler *this,VectorXi *outputChannels,MatrixXd *positions)

{
  this->_vptr_RegionHandler = (_func_int **)&PTR___cxa_pure_virtual_0020f9f8;
  Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<int,__1,__1,_1,_0> *)&this->_outputChannels,
             (DenseStorage<int,__1,__1,_1,_0> *)outputChannels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->_positions,
             (DenseStorage<double,__1,__1,__1,_0> *)positions);
  return;
}

Assistant:

RegionHandler::RegionHandler(Eigen::VectorXi outputChannels,
                               Eigen::MatrixXd positions)
      : _outputChannels(outputChannels), _positions(positions){}